

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HestonLogSpotPathSimulator.cpp
# Opt level: O0

void __thiscall BroadieKayaScheme::preComputations(BroadieKayaScheme *this)

{
  double dVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  ulong local_80;
  size_t i;
  double delta;
  double eps;
  double kappa;
  double theta;
  double rho;
  HestonModel hestonModel;
  BroadieKayaScheme *this_local;
  
  hestonModel.initialAssetValue_ = (double)this;
  HestonVariancePathSimulator::getHestonModel
            ((HestonModel *)&rho,(this->super_HestonLogSpotPathSimulator).variancePathSimulator_);
  theta = HestonModel::getCorrelation((HestonModel *)&rho);
  kappa = HestonModel::getMeanReversionLevel((HestonModel *)&rho);
  eps = HestonModel::getMeanReversionSpeed((HestonModel *)&rho);
  delta = HestonModel::getVolOfVol((HestonModel *)&rho);
  local_80 = 0;
  while( true ) {
    uVar2 = local_80;
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      (&(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_);
    if (sVar3 - 1 <= uVar2) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_,
                        local_80 + 1);
    dVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(this->super_HestonLogSpotPathSimulator).super_PathSimulator.timePoints_,
                        local_80);
    i = (size_t)(dVar1 - *pvVar4);
    local_88 = (-theta * eps * kappa * (double)i) / delta;
    std::vector<double,_std::allocator<double>_>::push_back(&this->k0_,&local_88);
    local_90 = this->gamma1_ * (double)i * ((eps * theta) / delta - 0.5) + -(theta / delta);
    std::vector<double,_std::allocator<double>_>::push_back(&this->k1_,&local_90);
    local_98 = this->gamma2_ * (double)i * ((eps * theta) / delta - 0.5) + theta / delta;
    std::vector<double,_std::allocator<double>_>::push_back(&this->k2_,&local_98);
    local_a0 = this->gamma1_ * (double)i * (-theta * theta + 1.0);
    std::vector<double,_std::allocator<double>_>::push_back(&this->k3_,&local_a0);
    local_a8 = this->gamma2_ * (double)i * (-theta * theta + 1.0);
    std::vector<double,_std::allocator<double>_>::push_back(&this->k4_,&local_a8);
    local_80 = local_80 + 1;
  }
  return;
}

Assistant:

void BroadieKayaScheme::preComputations()
{
    HestonModel hestonModel = variancePathSimulator_->getHestonModel();
    double rho = hestonModel.getCorrelation();
    double theta = hestonModel.getMeanReversionLevel();
    double kappa = hestonModel.getMeanReversionSpeed();
    double eps = hestonModel.getVolOfVol();
    double delta;

    //NB : we allow the time grid to be non-equidistant so that the computed quantities are time dependent
    for(std::size_t i = 0; i < timePoints_.size()-1; i++)
    {
        delta = timePoints_[i+1] - timePoints_[i];
        k0_.push_back(-rho*kappa*theta*delta/eps);
        k1_.push_back(gamma1_*delta*(kappa*rho/eps-0.5)-rho/eps);
        k2_.push_back(gamma2_*delta*(kappa*rho/eps-0.5)+rho/eps);
        k3_.push_back(gamma1_*delta*(1.-rho*rho));
        k4_.push_back(gamma2_*delta*(1.-rho*rho));
    }
}